

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O2

void __thiscall
BiquadFilter::SetupPeaking(BiquadFilter *this,float cutoff,float samplerate,float gain,float Q)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar3 = (cutoff * 6.2831855) / samplerate;
  fVar4 = powf(10.0,gain * 0.025);
  fVar5 = sinf(fVar3);
  fVar5 = fVar5 / (Q + Q);
  fVar6 = fVar5 * fVar4;
  this->b0 = fVar6 + 1.0;
  fVar7 = cosf(fVar3);
  this->b1 = fVar7 * -2.0;
  this->b2 = 1.0 - fVar6;
  fVar5 = fVar5 / fVar4;
  fVar3 = cosf(fVar3);
  fVar4 = 1.0 / (fVar5 + 1.0);
  uVar1 = this->b0;
  uVar2 = this->b1;
  this->a1 = fVar3 * -2.0 * fVar4;
  this->a2 = (1.0 - fVar5) * fVar4;
  this->b0 = (float)uVar1 * fVar4;
  this->b1 = (float)uVar2 * fVar4;
  this->b2 = fVar4 * this->b2;
  return;
}

Assistant:

void BiquadFilter::SetupPeaking(float cutoff, float samplerate, float gain, float Q)
{
    float w0 = 2.0f * kPI * cutoff / samplerate, A = powf(10.0f, gain * 0.025f), alpha = sinf(w0) / (2.0f * Q), a0;
    b0 = 1.0f + alpha * A;
    b1 = -2.0f * cosf(w0);
    b2 = 1.0f - alpha * A;
    a0 = 1.0f + alpha / A;
    a1 = -2.0f * cosf(w0);
    a2 = 1.0f - alpha / A;
    float inv_a0 = 1.0f / a0; a1 *= inv_a0; a2 *= inv_a0; b0 *= inv_a0; b1 *= inv_a0; b2 *= inv_a0;
}